

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

void cppqc::detail::TupleGeneratorHelper_shrink<0,std::vector<int,std::allocator<int>>>::
     appendShrinks<std::tuple<cppqc::Generator<std::vector<int,std::allocator<int>>>>>
               (tuple<std::vector<int,_std::allocator<int>_>_> *shrinkInput,
               vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
               *shrinkOutput,
               tuple<cppqc::Generator<std::vector<int,_std::allocator<int>_>_>_> *generators)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> *this;
  tuple<cppqc::Generator<std::vector<int,_std::allocator<int>_>_>_> *in_RDX;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
  *in_RSI;
  tuple<std::vector<int,_std::allocator<int>_>_> *in_RDI;
  tuple<std::vector<int,_std::allocator<int>_>_> copiedShrinkInput;
  vector<int,_std::allocator<int>_> *localShrink;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range3;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  allLocalShrinks;
  tuple<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff68;
  tuple<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff70;
  Generator<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff78;
  vector<int,_std::allocator<int>_> *__x;
  vector<int,_std::allocator<int>_> local_68;
  tuple<std::vector<int,_std::allocator<int>_>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  local_40;
  undefined1 *local_38;
  undefined1 local_30 [24];
  tuple<cppqc::Generator<std::vector<int,_std::allocator<int>_>_>_> *local_18;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
  *local_10;
  tuple<std::vector<int,_std::allocator<int>_>_> *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  this = (vector<int,_std::allocator<int>_> *)
         std::get<0ul,cppqc::Generator<std::vector<int,std::allocator<int>>>>
                   ((tuple<cppqc::Generator<std::vector<int,_std::allocator<int>_>_>_> *)0x42808c);
  std::get<0ul,std::vector<int,std::allocator<int>>>
            ((tuple<std::vector<int,_std::allocator<int>_>_> *)0x42809e);
  Generator<std::vector<int,_std::allocator<int>_>_>::shrink
            (in_stack_ffffffffffffff78,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70);
  local_38 = local_30;
  local_40._M_current =
       (vector<int,_std::allocator<int>_> *)
       std::
       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ::begin((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)in_stack_ffffffffffffff68);
  local_48 = (vector<int,_std::allocator<int>_> *)
             std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::end((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    local_50 = (tuple<std::vector<int,_std::allocator<int>_>_> *)
               __gnu_cxx::
               __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator*(&local_40);
    std::tuple<std::vector<int,_std::allocator<int>_>_>::tuple
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    __x = &local_68;
    in_stack_ffffffffffffff70 = local_50;
    std::get<0ul,std::vector<int,std::allocator<int>>>
              ((tuple<std::vector<int,_std::allocator<int>_>_> *)0x42812c);
    std::vector<int,_std::allocator<int>_>::operator=(this,__x);
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
    ::push_back((vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
                 *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::tuple<std::vector<int,_std::allocator<int>_>_>::~tuple
              ((tuple<std::vector<int,_std::allocator<int>_>_> *)0x428157);
    __gnu_cxx::
    __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::operator++(&local_40);
  }
  TupleGeneratorHelper_shrink<-1,std::vector<int,std::allocator<int>>>::
  appendShrinks<std::tuple<cppqc::Generator<std::vector<int,std::allocator<int>>>>>
            (local_8,local_10,local_18);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)this);
  return;
}

Assistant:

static void appendShrinks(const std::tuple<T...>& shrinkInput,
                            std::vector<std::tuple<T...>>& shrinkOutput,
                            const Generators& generators) {
    // Compute all shrink combinations for the tuple
    // element at the position "offset".
    // All other elements will not be changed.
    static_assert(offset >= 0 && offset < sizeof...(T), "offset out of bounds");
    auto allLocalShrinks =
        std::get<offset>(generators).shrink(std::get<offset>(shrinkInput));
    for (auto&& localShrink : allLocalShrinks) {
      auto copiedShrinkInput = shrinkInput;
      std::get<offset>(copiedShrinkInput) = std::move(localShrink);
      shrinkOutput.push_back(std::move(copiedShrinkInput));
    }

    // continue recursion (from right to left)
    TupleGeneratorHelper_shrink<offset - 1, T...>::appendShrinks(
        shrinkInput, shrinkOutput, generators);
  }